

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O2

bool __thiscall CDirectiveData::Validate(CDirectiveData *this)

{
  long lVar1;
  bool bVar2;
  u64 uVar3;
  size_t bytes;
  long lVar4;
  size_t i;
  ulong uVar5;
  int num;
  
  uVar3 = FileManager::getVirtualAddress(g_fileManager);
  this->RamPos = uVar3;
  lVar4 = 8;
  uVar5 = 0;
  do {
    if (this->TotalAmount <= uVar5) {
      return false;
    }
    lVar1 = *(long *)(&this->Entries->String + lVar4);
    if (*(char *)((long)this->Entries + lVar4 + -8) == '\0') {
      bVar2 = evalExpression(this->ExpData + lVar1,&num,true);
      if (!bVar2) {
        return false;
      }
      bytes = this->UnitSize;
    }
    else {
      bytes = this->UnitSize * (this->StrData).Entries[lVar1].len;
    }
    FileManager::advanceMemory(g_fileManager,bytes);
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x10;
  } while( true );
}

Assistant:

bool CDirectiveData::Validate()
{
	RamPos = g_fileManager->getVirtualAddress();

	int num;
	for (size_t i = 0; i < TotalAmount; i++)
	{
		if (Entries[i].String == false)
		{
			if (evalExpression(ExpData[Entries[i].num],num,true) == false)
				return false;
			g_fileManager->advanceMemory(UnitSize);
		} else {
			g_fileManager->advanceMemory(StrData.GetLen(Entries[i].num)*UnitSize);
		}
	}

	return false;
}